

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::FindConfig(cmFindPackageCommand *this)

{
  bool bVar1;
  allocator<char> local_59;
  string help;
  string init;
  
  ComputePrefixes(this);
  if ((((this->super_cmFindCommon).SearchFrameworkFirst == false) &&
      ((this->super_cmFindCommon).SearchFrameworkOnly != true)) ||
     (bVar1 = FindFrameworkConfig(this), !bVar1)) {
    if (((this->super_cmFindCommon).SearchAppBundleFirst == false) &&
       ((this->super_cmFindCommon).SearchAppBundleOnly != true)) {
      bVar1 = false;
LAB_001de32d:
      if (((this->super_cmFindCommon).SearchFrameworkOnly == false) &&
         ((this->super_cmFindCommon).SearchAppBundleOnly == false)) {
        bVar1 = FindPrefixedConfig(this);
      }
    }
    else {
      bVar1 = FindAppBundleConfig(this);
      if (!bVar1) goto LAB_001de32d;
    }
    if ((bVar1 == false) && ((this->super_cmFindCommon).SearchFrameworkLast == true)) {
      bVar1 = FindFrameworkConfig(this);
    }
    if ((bVar1 == false) && ((this->super_cmFindCommon).SearchAppBundleLast == true)) {
      bVar1 = FindAppBundleConfig(this);
    }
    init._M_dataplus._M_p = (pointer)&init.field_2;
    init._M_string_length = 0;
    init.field_2._M_local_buf[0] = '\0';
    if (bVar1 == false) {
      std::operator+(&help,&this->Variable,"-NOTFOUND");
      std::__cxx11::string::operator=((string *)&init,(string *)&help);
      std::__cxx11::string::~string((string *)&help);
      bVar1 = false;
      goto LAB_001de3ea;
    }
  }
  init._M_dataplus._M_p = (pointer)&init.field_2;
  init.field_2._M_local_buf[0] = '\0';
  init._M_string_length = 0;
  cmsys::SystemTools::GetFilenamePath(&help,&this->FileFound);
  std::__cxx11::string::operator=((string *)&init,(string *)&help);
  std::__cxx11::string::~string((string *)&help);
  bVar1 = true;
LAB_001de3ea:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&help,"The directory containing a CMake configuration file for ",&local_59);
  std::__cxx11::string::append((string *)&help);
  std::__cxx11::string::append((char *)&help);
  cmMakefile::AddCacheDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable,
             init._M_dataplus._M_p,help._M_dataplus._M_p,PATH,true);
  std::__cxx11::string::~string((string *)&help);
  std::__cxx11::string::~string((string *)&init);
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::FindConfig()
{
  // Compute the set of search prefixes.
  this->ComputePrefixes();

  // Look for the project's configuration file.
  bool found = false;

  // Search for frameworks.
  if (!found && (this->SearchFrameworkFirst || this->SearchFrameworkOnly)) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && (this->SearchAppBundleFirst || this->SearchAppBundleOnly)) {
    found = this->FindAppBundleConfig();
  }

  // Search prefixes.
  if (!found && !(this->SearchFrameworkOnly || this->SearchAppBundleOnly)) {
    found = this->FindPrefixedConfig();
  }

  // Search for frameworks.
  if (!found && this->SearchFrameworkLast) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && this->SearchAppBundleLast) {
    found = this->FindAppBundleConfig();
  }

  // Store the entry in the cache so it can be set by the user.
  std::string init;
  if (found) {
    init = cmSystemTools::GetFilenamePath(this->FileFound);
  } else {
    init = this->Variable + "-NOTFOUND";
  }
  std::string help =
    "The directory containing a CMake configuration file for ";
  help += this->Name;
  help += ".";
  // We force the value since we do not get here if it was already set.
  this->Makefile->AddCacheDefinition(this->Variable, init.c_str(),
                                     help.c_str(), cmStateEnums::PATH, true);
  return found;
}